

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::TestFactoryImpl<Laplace2DProblem_heat_Test>::CreateTest
          (TestFactoryImpl<Laplace2DProblem_heat_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x110);
  Test::Test(this_00);
  memset(this_00 + 1,0,0x100);
  this_00->_vptr_Test = (_func_int **)&PTR__Laplace2DProblem_0015d840;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }